

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O3

void __thiscall btSoftBody::updateBounds(btSoftBody *this)

{
  undefined8 uVar1;
  btDbvtNode *pbVar2;
  btBroadphaseProxy *pbVar3;
  btBroadphaseInterface *pbVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float extraout_XMM0_Da;
  
  pbVar2 = (this->m_ndbvt).m_root;
  if (pbVar2 == (btDbvtNode *)0x0) {
    this->m_bounds[1].m_floats[0] = 0.0;
    this->m_bounds[1].m_floats[1] = 0.0;
    this->m_bounds[1].m_floats[2] = 0.0;
    this->m_bounds[1].m_floats[3] = 0.0;
    this->m_bounds[0].m_floats[0] = 0.0;
    this->m_bounds[0].m_floats[1] = 0.0;
    this->m_bounds[0].m_floats[2] = 0.0;
    this->m_bounds[0].m_floats[3] = 0.0;
  }
  else {
    (*((this->super_btCollisionObject).m_collisionShape)->_vptr_btCollisionShape[0xc])();
    uVar1 = *(undefined8 *)(pbVar2->volume).mi.m_floats;
    auVar5._4_4_ = (float)((ulong)uVar1 >> 0x20) - extraout_XMM0_Da;
    auVar5._0_4_ = (float)uVar1 - extraout_XMM0_Da;
    auVar5._8_4_ = (pbVar2->volume).mi.m_floats[2] - extraout_XMM0_Da;
    auVar5._12_4_ = 0;
    *(undefined1 (*) [16])this->m_bounds[0].m_floats = auVar5;
    uVar1 = *(undefined8 *)(pbVar2->volume).mx.m_floats;
    auVar6._4_4_ = (float)((ulong)uVar1 >> 0x20) + extraout_XMM0_Da;
    auVar6._0_4_ = (float)uVar1 + extraout_XMM0_Da;
    auVar6._8_4_ = extraout_XMM0_Da + (pbVar2->volume).mx.m_floats[2];
    auVar6._12_4_ = 0;
    *(undefined1 (*) [16])this->m_bounds[1].m_floats = auVar6;
    pbVar3 = (this->super_btCollisionObject).m_broadphaseHandle;
    if (pbVar3 != (btBroadphaseProxy *)0x0) {
      pbVar4 = this->m_worldInfo->m_broadphase;
      (*pbVar4->_vptr_btBroadphaseInterface[4])
                (pbVar4,pbVar3,this->m_bounds,this->m_bounds + 1,this->m_worldInfo->m_dispatcher);
      return;
    }
  }
  return;
}

Assistant:

void					btSoftBody::updateBounds()
{
	/*if( m_acceleratedSoftBody )
	{
		// If we have an accelerated softbody we need to obtain the bounds correctly
		// For now (slightly hackily) just have a very large AABB
		// TODO: Write get bounds kernel
		// If that is updating in place, atomic collisions might be low (when the cloth isn't perfectly aligned to an axis) and we could
		// probably do a test and exchange reasonably efficiently.

		m_bounds[0] = btVector3(-1000, -1000, -1000);
		m_bounds[1] = btVector3(1000, 1000, 1000);

	} else {*/
		if(m_ndbvt.m_root)
		{
			const btVector3&	mins=m_ndbvt.m_root->volume.Mins();
			const btVector3&	maxs=m_ndbvt.m_root->volume.Maxs();
			const btScalar		csm=getCollisionShape()->getMargin();
			const btVector3		mrg=btVector3(	csm,
				csm,
				csm)*1; // ??? to investigate...
			m_bounds[0]=mins-mrg;
			m_bounds[1]=maxs+mrg;
			if(0!=getBroadphaseHandle())
			{					
				m_worldInfo->m_broadphase->setAabb(	getBroadphaseHandle(),
					m_bounds[0],
					m_bounds[1],
					m_worldInfo->m_dispatcher);
			}
		}
		else
		{
			m_bounds[0]=
				m_bounds[1]=btVector3(0,0,0);
		}		
	//}
}